

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlCrc32.cpp
# Opt level: O0

bool libebml::EbmlCrc32::CheckCRC(uint32 inputCRC,binary *input,uint32 length)

{
  bool bVar1;
  uint uVar2;
  uint local_20;
  uint32 local_1c;
  uint32 crc;
  uint32 length_local;
  binary *input_local;
  uint32 inputCRC_local;
  
  local_20 = 0xffffffff;
  _crc = (uint *)input;
  for (local_1c = length; bVar1 = IsAligned<unsigned_int>(_crc,(uint *)0x0), !bVar1 && local_1c != 0
      ; local_1c = local_1c - 1) {
    local_20 = *(uint *)(m_tab + (ulong)(local_20 & 0xff ^ (uint)(byte)*_crc) * 4) ^ local_20 >> 8;
    _crc = (uint *)((long)_crc + 1);
  }
  for (; 3 < local_1c; local_1c = local_1c - 4) {
    uVar2 = *(uint *)(m_tab + (ulong)((*_crc ^ local_20) & 0xff) * 4) ^ (*_crc ^ local_20) >> 8;
    uVar2 = *(uint *)(m_tab + (ulong)(uVar2 & 0xff) * 4) ^ uVar2 >> 8;
    uVar2 = *(uint *)(m_tab + (ulong)(uVar2 & 0xff) * 4) ^ uVar2 >> 8;
    local_20 = *(uint *)(m_tab + (ulong)(uVar2 & 0xff) * 4) ^ uVar2 >> 8;
    _crc = _crc + 1;
  }
  while (local_1c != 0) {
    local_20 = *(uint *)(m_tab + (ulong)(local_20 & 0xff ^ (uint)(byte)*_crc) * 4) ^ local_20 >> 8;
    local_1c = local_1c - 1;
    _crc = (uint *)((long)_crc + 1);
  }
  return (local_20 ^ 0xffffffff) == inputCRC;
}

Assistant:

bool EbmlCrc32::CheckCRC(uint32 inputCRC, const binary *input, uint32 length)
{
  uint32 crc = CRC32_NEGL;

  for(; !IsAligned<uint32>(input) && length > 0; length--)
    crc = m_tab[CRC32_INDEX(crc) ^ *input++] ^ CRC32_SHIFTED(crc);

  while (length >= 4) {
    crc ^= *(const uint32 *)input;
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    length -= 4;
    input += 4;
  }

  while (length--)
    crc = m_tab[CRC32_INDEX(crc) ^ *input++] ^ CRC32_SHIFTED(crc);

  //Now we finalize the CRC32
  crc ^= CRC32_NEGL;

  if (crc == inputCRC)
    return true;

  return false;
}